

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qualsource.cpp
# Opt level: O2

bool QualSource::addSource(Node *node,int t,double b,Pattern *p)

{
  QualSource *this;
  
  this = node->qualSource;
  if (this == (QualSource *)0x0) {
    this = (QualSource *)operator_new(0x30);
    QualSource(this);
    node->qualSource = this;
  }
  this->type = t;
  this->base = b;
  this->pattern = p;
  this->outflow = 0.0;
  this->quality = 0.0;
  return true;
}

Assistant:

bool QualSource::addSource(Node* node, int t, double b, Pattern* p)
{
    if ( node->qualSource == nullptr )
    {
        node->qualSource = new QualSource();
        if ( node->qualSource == nullptr ) return false;
    }
    node->qualSource->type = t;
    node->qualSource->base = b;
    node->qualSource->pattern = p;
    node->qualSource->quality = 0.0;
    node->qualSource->outflow = 0.0;
    return true;
}